

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O0

void __thiscall filehandle::~filehandle(filehandle *this)

{
  filehandle *this_local;
  
  std::shared_ptr<filehandle::ptr>::~shared_ptr(&this->_p);
  return;
}

Assistant:

struct filehandle {

    // the 'ptr' class owns the filehandle,
    // the 'filehandle' has a shared_ptr to the 'ptr',
    // this makes sure the object can be copied as needed.
    struct ptr {
        int fh = -1;
        ptr(int fh)
            : fh(fh)
        {
        }
        ~ptr() { close(); }

        bool empty() const { return fh==-1; }

        void close()
        {
            if (fh==-1)
                return;
            if (-1 == ::close(fh)) {
                fh = -1;
                throw std::system_error(errno, std::generic_category(), "close");
            }
            fh = -1;
        }
    };
    std::shared_ptr<ptr> _p;


    filehandle() { }

    // the copy constructor is implemented in terms of the assignment operator.
    filehandle(const filehandle& fh)
    {
        *this = fh;
    }

    // construct with `int` is implemented using `assign int`.
    filehandle(int fh)
    {
        *this = fh;
    }

    // construct with path + flags opens a filesystem file.
    filehandle(const std::string& filename, int openflags = O_RDONLY, int mode=0666)
    {
        open(filename, openflags, mode);
    }

    void open(const std::string& filename, int openflags = O_RDONLY, int mode=0666)
    {
        *this = ::open(filename.c_str(), openflags, mode);
    }

    // discards and optionally closes any handle currently retained,
    // before creating a new wrapped filehandle.
    filehandle& operator=(int fh)
    { 
        if (fh==-1)
            throw std::system_error(errno, std::generic_category());
        _p = std::make_shared<ptr>(fh);
        return *this;
    }
    // copies the wrapped handle from the passed handle.
    filehandle& operator=(const filehandle& fh)
    {
        _p = fh._p;
        return *this;
    }
    bool empty() const { return !_p || _p->empty(); }

    // boolean-context checks if the filehandle has been set.
    operator bool () const { return !empty(); }


    // int-context returns the filehandle, so it can be passed to posix functions.
    operator int () const { return fh(); }
    int fh() const {
        if (!_p) throw std::runtime_error("no filehandle set");
        return _p->fh;
    }

    // explicitly close the filehandle.
    // note: other copies will note an exception when using the handle.
    void close() {
        if (!_p) throw std::runtime_error("no filehandle set");
        _p->close();
    }

    // for regular-files, returns the filesize,
    // for block-devices, returns the device size.
    uint64_t size()
    {
        struct stat st;
        if (fstat(fh(), &st))
            throw std::system_error(errno, std::generic_category(), "fstat");

        if (st.st_mode&S_IFREG)
            return st.st_size;
#ifndef _WIN32
        else if (st.st_mode&S_IFBLK) {
#ifdef DKIOCGETBLOCKCOUNT
            uint64_t bkcount;
            uint32_t bksize;
            if (-1==ioctl(fh(), DKIOCGETBLOCKCOUNT, &bkcount))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKCOUNT)");
            if (-1==ioctl(fh(), DKIOCGETBLOCKSIZE, &bksize))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKSIZE)");
            return bkcount*bksize;
#elif defined(BLKGETSIZE64)
            uint64_t devsize;
            if (-1==ioctl(fh(), BLKGETSIZE64, &devsize))
                throw std::system_error(errno, std::generic_category(), "ioctl(BLKGETSIZE64)");
            return devsize;
#else
            throw std::runtime_error("size not implemented for block dev");
#endif
        }
#endif
        else {
            // pipe or socket
            throw std::runtime_error("size not implemented for pipe or socket");
        }
    }

    // note: this changes the process-global, OS maintained file pointer.
    uint64_t seek(int64_t pos, int whence=SEEK_SET)
    {
        auto rc = ::lseek(fh(), pos, whence);
        if (rc == -1)
            throw std::system_error(errno, std::generic_category(), "lseek");
        return rc;
    }